

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O1

void __thiscall
LinearScan::WriteThroughForLocal
          (LinearScan *this,RegOpnd *regOpnd,Lifetime *lifetime,Instr *instrInsertAfter)

{
  StackSym *sym;
  code *pcVar1;
  bool bVar2;
  RegSlot regSlotId;
  int32 iVar3;
  undefined4 *puVar4;
  
  if (regOpnd == (RegOpnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0x3f9,"(regOpnd)","regOpnd");
    if (!bVar2) goto LAB_0058b38c;
    *puVar4 = 0;
  }
  if (lifetime == (Lifetime *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0x3fa,"(lifetime)","lifetime");
    if (!bVar2) goto LAB_0058b38c;
    *puVar4 = 0;
  }
  if (instrInsertAfter == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0x3fb,"(instrInsertAfter)","instrInsertAfter");
    if (!bVar2) goto LAB_0058b38c;
    *puVar4 = 0;
  }
  sym = regOpnd->m_sym;
  bVar2 = IsSymNonTempLocalVar(this,sym);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0x3fe,"(IsSymNonTempLocalVar(sym))","IsSymNonTempLocalVar(sym)");
    if (!bVar2) {
LAB_0058b38c:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  regSlotId = StackSym::GetByteCodeRegSlot(sym);
  iVar3 = GetStackOffset(this,regSlotId);
  sym->m_offset = iVar3;
  sym->field_0x19 = sym->field_0x19 | 0x10;
  InsertStore(this,instrInsertAfter,sym,lifetime->reg);
  return;
}

Assistant:

void
LinearScan::WriteThroughForLocal(IR::RegOpnd* regOpnd, Lifetime* lifetime, IR::Instr* instrInsertAfter)
{
    Assert(regOpnd);
    Assert(lifetime);
    Assert(instrInsertAfter);

    StackSym* sym = regOpnd->m_sym;
    Assert(IsSymNonTempLocalVar(sym));

    Js::RegSlot slotIndex = sym->GetByteCodeRegSlot();

    // First we insert the write through moves

    sym->m_offset = GetStackOffset(slotIndex);
    sym->m_allocated = true;
    // Save the value on reg to local var slot.
    this->InsertStore(instrInsertAfter, sym, lifetime->reg);
}